

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.hpp
# Opt level: O2

void __thiscall
de::PoolArray<vkt::(anonymous_namespace)::Program,_8U>::resize
          (PoolArray<vkt::(anonymous_namespace)::Program,_8U> *this,deUintptr newSize)

{
  void **ppvVar1;
  void *pvVar2;
  ulong uVar3;
  deUintptr val_1;
  void **ppvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  deUintptr dVar8;
  deUintptr val;
  ProgramIdentifier *this_00;
  deUintptr ndx;
  deUintptr dVar9;
  bool bVar10;
  allocator<char> local_7a;
  allocator<char> local_79;
  ulong local_78;
  string local_70;
  string local_50;
  
  dVar8 = this->m_numElements;
  uVar5 = newSize;
  if (newSize < dVar8) {
    for (; uVar5 < dVar8; uVar5 = uVar5 + 1) {
      vkt::anon_unknown_0::Program::~Program
                ((Program *)
                 ((ulong)((uint)uVar5 & 0xf) * 0xa0 + (long)this->m_pageTable[uVar5 >> 4]));
      dVar8 = this->m_numElements;
    }
    this->m_numElements = newSize;
  }
  else if (dVar8 < newSize) {
    uVar5 = this->m_capacity;
    if (uVar5 <= newSize) {
      local_78 = newSize + 0xf >> 4;
      uVar3 = 0;
      ppvVar4 = (void **)0x0;
      if (this->m_pageTableCapacity < local_78) {
        uVar7 = this->m_pageTableCapacity * 2;
        if (uVar7 <= local_78) {
          uVar7 = local_78;
        }
        ppvVar1 = (void **)MemPool::alloc(this->m_pool,uVar7 * 8);
        uVar3 = this->m_pageTableCapacity;
        for (uVar5 = 0; uVar6 = uVar3, uVar3 != uVar5; uVar5 = uVar5 + 1) {
          ppvVar1[uVar5] = this->m_pageTable[uVar5];
        }
        for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
          ppvVar1[uVar6] = (void *)0x0;
        }
        uVar5 = this->m_capacity;
        ppvVar4 = this->m_pageTable;
        uVar3 = uVar3 << 3;
        this->m_pageTable = ppvVar1;
        this->m_pageTableCapacity = uVar7;
      }
      uVar7 = uVar5 >> 4;
      dVar9 = uVar5 & 0xfffffffffffffff0;
      while( true ) {
        pvVar2 = (void *)((long)ppvVar4 + 7U & 0xfffffffffffffff8);
        uVar5 = (long)pvVar2 + (0xa00 - (long)ppvVar4);
        bVar10 = uVar3 < uVar5;
        uVar3 = uVar3 - uVar5;
        if (bVar10) break;
        this->m_pageTable[uVar7] = pvVar2;
        uVar7 = uVar7 + 1;
        ppvVar4 = (void **)((long)pvVar2 + 0xa00);
        dVar9 = dVar9 + 0x10;
      }
      for (; uVar7 < local_78; uVar7 = uVar7 + 1) {
        pvVar2 = MemPool::alignedAlloc(this->m_pool,0xa00,8);
        this->m_pageTable[uVar7] = pvVar2;
        dVar9 = dVar9 + 0x10;
      }
      this->m_capacity = dVar9;
    }
    this->m_numElements = newSize;
    for (; dVar8 < newSize; dVar8 = dVar8 + 1) {
      this_00 = (ProgramIdentifier *)
                ((ulong)((uint)dVar8 & 0xf) * 0xa0 + (long)this->m_pageTable[dVar8 >> 4]);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_79);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_7a);
      ::vk::BinaryRegistryDetail::ProgramIdentifier::ProgramIdentifier(this_00,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      *(undefined4 *)&this_00[1].testCasePath._M_dataplus._M_p = 0;
      this_00[1].testCasePath._M_string_length =
           (size_type)((long)&this_00[1].testCasePath.field_2 + 8);
      this_00[1].testCasePath.field_2._M_allocated_capacity = 0;
      this_00[1].testCasePath.field_2._M_local_buf[8] = '\0';
      this_00[1].programName._M_string_length = 0;
      this_00[1].programName.field_2._M_allocated_capacity = 0;
      *(undefined4 *)((long)&this_00[1].programName.field_2 + 8) = 0;
      this_00[2].testCasePath._M_dataplus._M_p = (pointer)&this_00[2].testCasePath.field_2;
      this_00[2].testCasePath._M_string_length = 0;
      this_00[2].testCasePath.field_2._M_local_buf[0] = '\0';
      newSize = this->m_numElements;
    }
  }
  return;
}

Assistant:

inline void PoolArray<T, Alignment>::resize (deUintptr newSize)
{
	if (newSize < m_numElements)
	{
		// Destruct elements that are no longer active.
		for (deUintptr ndx = newSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::destruct(getPtr(ndx));

		m_numElements = newSize;
	}
	else if (newSize > m_numElements)
	{
		deUintptr prevSize = m_numElements;

		reserve(newSize);
		m_numElements = newSize;

		// Fill new elements with default values
		for (deUintptr ndx = prevSize; ndx < m_numElements; ndx++)
			PoolArrayElement<T>::constructDefault(getPtr(ndx));
	}
}